

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O0

bool cmOptionCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmValue cVar1;
  bool bVar2;
  CacheEntryType CVar3;
  PolicyStatus PVar4;
  size_type sVar5;
  cmMakefile *pcVar6;
  const_reference pvVar7;
  cmState *this;
  const_reference value;
  string *psVar8;
  char *value_00;
  char *doc;
  PolicyID id;
  bool local_281;
  cmAlphaNum local_280;
  string local_250;
  cmAlphaNum local_230;
  string local_200;
  cmStateSnapshot local_1e0;
  cmValue local_1c8;
  cmValue *local_1c0;
  cmValue *existsAfterSet;
  string_view local_1a0;
  byte local_18b;
  byte local_18a;
  allocator<char> local_189;
  string local_188 [5];
  bool init;
  string initialValue;
  string local_160;
  cmValue local_140;
  cmValue existingValue;
  cmState *state;
  cmStateSnapshot local_128;
  cmValue local_110;
  cmValue *local_108;
  cmValue *existsBeforeSet;
  byte local_f5;
  PolicyStatus policyStatus;
  bool checkAndWarn;
  string_view local_e8;
  string_view local_d8;
  string local_c8;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string m;
  bool argError;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  local_281 = true;
  if (1 < sVar5) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    local_281 = 3 < sVar5;
  }
  m.field_2._M_local_buf[0xf] = local_281;
  if (local_281 == false) {
    local_f5 = 0;
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    existsBeforeSet._4_4_ = cmMakefile::GetPolicyStatus(pcVar6,CMP0077,false);
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    cmMakefile::GetStateSnapshot(&local_128,pcVar6);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    local_110 = cmStateSnapshot::GetDefinition(&local_128,pvVar7);
    local_108 = &local_110;
    if (existsBeforeSet._4_4_ != OLD) {
      if (existsBeforeSet._4_4_ == WARN) {
        local_f5 = operator!=(local_110,(nullptr_t)0x0);
      }
      else if ((existsBeforeSet._4_4_ - NEW < 3) &&
              (bVar2 = cmValue::operator_cast_to_bool(local_108), bVar2)) {
        return true;
      }
    }
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    this = cmMakefile::GetState(pcVar6);
    existingValue.Value = (string *)this;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    local_140 = cmState::GetCacheEntryValue(this,pvVar7);
    bVar2 = cmValue::operator_cast_to_bool(&local_140);
    cVar1 = existingValue;
    if (bVar2) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      CVar3 = cmState::GetCacheEntryType((cmState *)cVar1.Value,pvVar7);
      cVar1 = existingValue;
      if (CVar3 != UNINITIALIZED) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"HELPSTRING",
                   (allocator<char> *)(initialValue.field_2._M_local_buf + 0xf));
        value = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](args,1);
        cmState::SetCacheEntryProperty((cmState *)cVar1.Value,pvVar7,&local_160,value);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(initialValue.field_2._M_local_buf + 0xf));
        return true;
      }
    }
    bVar2 = cmValue::operator_cast_to_bool(&local_140);
    local_18a = 0;
    if (bVar2) {
      psVar8 = cmValue::operator*[abi_cxx11_(&local_140);
      std::__cxx11::string::string(local_188,(string *)psVar8);
    }
    else {
      std::allocator<char>::allocator();
      local_18a = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_188,"Off",&local_189);
    }
    if ((local_18a & 1) != 0) {
      std::allocator<char>::~allocator(&local_189);
    }
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar5 == 3) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
      std::__cxx11::string::operator=(local_188,(string *)pvVar7);
    }
    local_1a0 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_188);
    local_18b = cmIsOn(local_1a0);
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    value_00 = "OFF";
    if ((local_18b & 1) != 0) {
      value_00 = "ON";
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,1);
    doc = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition(pcVar6,pvVar7,value_00,doc,BOOL,false);
    pcVar6 = cmExecutionStatus::GetMakefile(status);
    PVar4 = cmMakefile::GetPolicyStatus(pcVar6,CMP0077,false);
    if (PVar4 != NEW) {
      pcVar6 = cmExecutionStatus::GetMakefile(status);
      PVar4 = cmMakefile::GetPolicyStatus(pcVar6,CMP0126,false);
      if (PVar4 == NEW) {
        pcVar6 = cmExecutionStatus::GetMakefile(status);
        cmMakefile::GetStateSnapshot((cmStateSnapshot *)&existsAfterSet,pcVar6);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmStateSnapshot::RemoveDefinition((cmStateSnapshot *)&existsAfterSet,pvVar7);
      }
    }
    if ((local_f5 & 1) != 0) {
      pcVar6 = cmExecutionStatus::GetMakefile(status);
      cmMakefile::GetStateSnapshot(&local_1e0,pcVar6);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      local_1c8 = cmStateSnapshot::GetDefinition(&local_1e0,pvVar7);
      local_1c0 = &local_1c8;
      bVar2 = cmValue::operator_cast_to_bool(local_1c0);
      if (!bVar2) {
        pcVar6 = cmExecutionStatus::GetMakefile(status);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x4d,id);
        cmAlphaNum::cmAlphaNum(&local_230,&local_250);
        cmAlphaNum::cmAlphaNum
                  (&local_280,
                   "\nFor compatibility with older versions of CMake, option is clearing the normal variable \'"
                  );
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmStrCat<std::__cxx11::string,char[3]>
                  (&local_200,&local_230,&local_280,pvVar7,(char (*) [3])0xd3b0af);
        cmMakefile::IssueMessage(pcVar6,AUTHOR_WARNING,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_250);
      }
    }
    args_local._7_1_ = true;
    std::__cxx11::string::~string(local_188);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_78,"called with incorrect number of arguments: ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8," ");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8);
    cmJoin(&local_c8,args,local_d8,local_e8);
    cmAlphaNum::cmAlphaNum(&local_a8,&local_c8);
    cmStrCat<>((string *)local_48,&local_78,&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    cmExecutionStatus::SetError(status,(string *)local_48);
    args_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_48);
  }
  return args_local._7_1_;
}

Assistant:

bool cmOptionCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = cmStrCat("called with incorrect number of arguments: ",
                             cmJoin(args, " "));
    status.SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto policyStatus =
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077);
    const auto& existsBeforeSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    switch (policyStatus) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = status.GetMakefile().GetState();
  cmValue existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? *existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmIsOn(initialValue);
  status.GetMakefile().AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                          args[1].c_str(), cmStateEnums::BOOL);
  if (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0077) !=
        cmPolicies::NEW &&
      status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0126) ==
        cmPolicies::NEW) {
    // if there was a definition then remove it
    status.GetMakefile().GetStateSnapshot().RemoveDefinition(args[0]);
  }

  if (checkAndWarn) {
    const auto& existsAfterSet =
      status.GetMakefile().GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0077),
                 "\n"
                 "For compatibility with older versions of CMake, option "
                 "is clearing the normal variable '",
                 args[0], "'."));
    }
  }
  return true;
}